

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O1

int memCmp(void *buf1,void *buf2,size_t count)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  octet *b2;
  octet *b1;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  bool bVar8;
  
  if (count == 0) {
    bVar8 = true;
    bVar3 = 0;
    bVar1 = 0;
    uVar5 = 0;
    uVar6 = 0;
  }
  else {
    sVar7 = 0;
    lVar4 = 0;
    uVar6 = 0;
    uVar5 = 0;
    bVar1 = 0;
    bVar3 = 0;
    do {
      uVar5 = (ulong)*(byte *)((long)buf1 + sVar7) | uVar5 << 8;
      uVar6 = (ulong)*(byte *)((long)buf2 + sVar7) | uVar6 << 8;
      lVar4 = lVar4 + 1;
      if (lVar4 == 8) {
        bVar2 = ~bVar1 & 1;
        if (uVar6 <= uVar5) {
          bVar2 = 0;
        }
        bVar3 = bVar3 | bVar2;
        bVar2 = ~bVar3 & 1;
        if (uVar5 <= uVar6) {
          bVar2 = 0;
        }
        bVar1 = bVar1 | bVar2;
        lVar4 = 0;
      }
      sVar7 = sVar7 + 1;
    } while (count != sVar7);
    bVar8 = lVar4 == 0;
  }
  if (!bVar8) {
    bVar2 = ~bVar1 & 1;
    if (uVar6 <= uVar5) {
      bVar2 = 0;
    }
    bVar3 = bVar3 | bVar2;
    bVar2 = ~bVar3 & 1;
    if (uVar5 <= uVar6) {
      bVar2 = 0;
    }
    bVar1 = bVar1 | bVar2;
  }
  return -(uint)bVar3 | (uint)bVar1;
}

Assistant:

int SAFE(memCmp)(const void* buf1, const void* buf2, size_t count)
{
	register word less = 0;
	register word greater = 0;
	register word w1 = 0;
	register word w2 = 0;
	const octet* b1 = (const octet*)buf1;
	const octet* b2 = (const octet*)buf2;
	size_t filled = 0;
	ASSERT(memIsValid(buf1, count));
	ASSERT(memIsValid(buf2, count));
	for (; count--; ++b1, ++b2)
	{
		w1 = w1 << 8 | *b1;
		w2 = w2 << 8 | *b2;
		if (++filled == O_PER_W)
		{
			less |= ~greater & wordLess(w1, w2);
			greater |= ~less & wordGreater(w1, w2);
			filled = 0;
		}
	}
	if (filled)
	{
		less |= ~greater & wordLess(w1, w2);
		greater |= ~less & wordGreater(w1, w2);
	}
	w1 = w2 = 0;
	return (wordEq(less, 0) - 1) | wordNeq(greater, 0);
}